

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopXfer(sqlite3 *db,WhereLoop *pTo,WhereLoop *pFrom)

{
  int iVar1;
  WhereLoop *pFrom_local;
  WhereLoop *pTo_local;
  sqlite3 *db_local;
  
  whereLoopClearUnion(db,pTo);
  if ((pTo->nLSlot < pFrom->nLTerm) &&
     (iVar1 = whereLoopResize(db,pTo,(uint)pFrom->nLTerm), iVar1 != 0)) {
    memset(pTo,0,0x38);
    db_local._4_4_ = 7;
  }
  else {
    memcpy(pTo,pFrom,0x38);
    memcpy(pTo->aLTerm,pFrom->aLTerm,(ulong)pTo->nLTerm << 3);
    if ((pFrom->wsFlags & 0x400) == 0) {
      if ((pFrom->wsFlags & 0x4000) != 0) {
        (pFrom->u).btree.pIndex = (Index *)0x0;
      }
    }
    else {
      *(byte *)((long)&pFrom->u + 4) = *(byte *)((long)&pFrom->u + 4) & 0xfe;
    }
    db_local._4_4_ = 0;
  }
  return db_local._4_4_;
}

Assistant:

static int whereLoopXfer(sqlite3 *db, WhereLoop *pTo, WhereLoop *pFrom){
  whereLoopClearUnion(db, pTo);
  if( pFrom->nLTerm > pTo->nLSlot
   && whereLoopResize(db, pTo, pFrom->nLTerm)
  ){
    memset(pTo, 0, WHERE_LOOP_XFER_SZ);
    return SQLITE_NOMEM_BKPT;
  }
  memcpy(pTo, pFrom, WHERE_LOOP_XFER_SZ);
  memcpy(pTo->aLTerm, pFrom->aLTerm, pTo->nLTerm*sizeof(pTo->aLTerm[0]));
  if( pFrom->wsFlags & WHERE_VIRTUALTABLE ){
    pFrom->u.vtab.needFree = 0;
  }else if( (pFrom->wsFlags & WHERE_AUTO_INDEX)!=0 ){
    pFrom->u.btree.pIndex = 0;
  }
  return SQLITE_OK;
}